

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O0

vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> * __thiscall
Epoll::getEventRequest(Epoll *this,int events_num)

{
  bool bVar1;
  reference pvVar2;
  element_type *this_00;
  element_type *this_01;
  int in_EDX;
  long in_RSI;
  vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> *in_RDI;
  SP_Channel cur_req;
  int fd;
  int i;
  vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> *req_data;
  shared_ptr<Channel> *in_stack_ffffffffffffefb8;
  Logger *in_stack_ffffffffffffefc0;
  vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> *this_02;
  Logger *in_stack_fffffffffffff000;
  __shared_ptr local_30 [16];
  int local_20;
  int local_1c;
  undefined1 local_15;
  int local_14;
  
  local_15 = 0;
  this_02 = in_RDI;
  local_14 = in_EDX;
  std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::vector
            ((vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> *)
             0x106875);
  for (local_1c = 0; local_1c < local_14; local_1c = local_1c + 1) {
    pvVar2 = std::vector<epoll_event,_std::allocator<epoll_event>_>::operator[]
                       ((vector<epoll_event,_std::allocator<epoll_event>_> *)(in_RSI + 8),
                        (long)local_1c);
    local_20 = (pvVar2->data).fd;
    std::shared_ptr<Channel>::shared_ptr
              ((shared_ptr<Channel> *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_30);
    if (bVar1) {
      this_00 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                           )0x1068fc);
      pvVar2 = std::vector<epoll_event,_std::allocator<epoll_event>_>::operator[]
                         ((vector<epoll_event,_std::allocator<epoll_event>_> *)(in_RSI + 8),
                          (long)local_1c);
      Channel::setRevents(this_00,pvVar2->events);
      this_01 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                           )0x106932);
      Channel::setEvents(this_01,0);
      std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::push_back
                (this_02,(value_type *)this_00);
    }
    else {
      Logger::Logger(in_stack_ffffffffffffefc0,(char *)in_stack_ffffffffffffefb8,0);
      in_stack_ffffffffffffefc0 = (Logger *)Logger::stream((Logger *)&stack0xffffffffffffefe8);
      LogStream::operator<<
                ((LogStream *)in_stack_ffffffffffffefc0,(char *)in_stack_ffffffffffffefb8);
      Logger::~Logger(in_stack_fffffffffffff000);
    }
    std::shared_ptr<Channel>::~shared_ptr((shared_ptr<Channel> *)0x1069e5);
  }
  return in_RDI;
}

Assistant:

std::vector<SP_Channel> Epoll::getEventRequest(int events_num){
    std::vector<SP_Channel> req_data;
    for (int i=0; i<events_num; ++i) {
        // 获取有事件产生的描述符
        int fd = events_[i].data.fd;

        SP_Channel cur_req = fd2chan_[fd];

        if (cur_req) {
            cur_req->setRevents(events_[i].events);
            cur_req->setEvents(0);
            // 加入线程池之前将timer和request分离
            // cur_req->seperateTimer();
            req_data.push_back(cur_req);
        }else {
            LOG<<"SP cur_req is invalid";
        }
    }
    return req_data;
}